

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O0

void time_compare(int n,char **ps,char *s,char *end)

{
  char **cps_00;
  char **cps;
  double total_reg;
  double total_set;
  double t_reg;
  double t_set;
  int local_30;
  int repeat;
  int i;
  int r;
  char *end_local;
  char *s_local;
  char **ps_local;
  int n_local;
  
  _i = end;
  end_local = s;
  s_local = (char *)ps;
  ps_local._4_4_ = n;
  cps_00 = (char **)malloc((long)n << 3);
  if (cps_00 != (char **)0x0) {
    t_set._4_4_ = (int)(100 / (long)ps_local._4_4_);
    cps = (char **)0x0;
    total_reg = 0.0;
    for (local_30 = 0; local_30 < ps_local._4_4_; local_30 = local_30 + 1) {
      fisher_yates_shuffle(ps_local._4_4_,(char **)s_local,cps_00);
      repeat = time_test(t_set._4_4_,ps_local._4_4_,cps_00,end_local,_i,&t_reg,&total_set);
      if (repeat != 0) {
        free(cps_00);
        return;
      }
      total_reg = t_reg + total_reg;
      cps = (char **)(total_set + (double)cps);
      repeat = 0;
    }
    free(cps_00);
    fprintf(_stdout,"POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",total_reg * 1000.0,
            (double)cps * 1000.0);
  }
  return;
}

Assistant:

static void
time_compare(int n, char* ps[], char* s, char* end)
{
  int r;
  int i;
  int repeat;
  double t_set, t_reg;
  double total_set, total_reg;
  char** cps;

  cps = (char** )malloc(sizeof(char*) * n);
  if (cps == 0) return ;

  repeat = 100 / n;
  total_set = total_reg = 0.0;
  for (i = 0; i < n; i++) {
    fisher_yates_shuffle(n, ps, cps);
    r = time_test(repeat, n, cps, s, end, &t_set, &t_reg);
    if (r != 0) {
      free(cps);
      return ;
    }
    total_set += t_set;
    total_reg += t_reg;
  }

  free(cps);

  fprintf(stdout, "POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",
          total_set * 1000.0, total_reg * 1000.0);
}